

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

int __thiscall QCssScanner_Generated::handleCommentStart(QCssScanner_Generated *this)

{
  long lVar1;
  char16_t *pcVar2;
  long lVar3;
  
  lVar1 = (this->input).d.size;
  if (this->pos < lVar1 + -1) {
    pcVar2 = (this->input).d.ptr;
    lVar3 = this->pos + 1;
    do {
      if ((pcVar2[lVar3 + -1] == L'*') && (pcVar2[lVar3] == L'/')) {
        this->pos = lVar3 + 1;
        return 1;
      }
      this->pos = lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  return 1;
}

Assistant:

int QCssScanner_Generated::handleCommentStart()
{
    while (pos < input.size() - 1) {
        if (input.at(pos) == u'*' && input.at(pos + 1) == u'/') {
            pos += 2;
            break;
        }
        ++pos;
    }
    return S;
}